

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_pipe_start(tcptran_pipe *p,nng_stream *conn,tcptran_ep *ep)

{
  undefined1 local_30 [8];
  nni_iov iov;
  tcptran_ep *ep_local;
  nng_stream *conn_local;
  tcptran_pipe *p_local;
  
  p->conn = conn;
  p->ep = ep;
  p->proto = ep->proto;
  p->txlen[0] = '\0';
  p->txlen[1] = 'S';
  p->txlen[2] = 'P';
  p->txlen[3] = '\0';
  p->txlen[4] = (uint8_t)(p->proto >> 8);
  p->txlen[5] = (uint8_t)p->proto;
  p->txlen[6] = '\0';
  p->txlen[7] = '\0';
  p->gotrxhead = 0;
  p->gottxhead = 0;
  p->wantrxhead = 8;
  p->wanttxhead = 8;
  iov.iov_buf = (void *)0x8;
  local_30 = (undefined1  [8])p->txlen;
  iov.iov_len = (size_t)ep;
  nni_aio_set_iov(&p->negoaio,1,(nni_iov *)local_30);
  nni_list_append((nni_list *)(iov.iov_len + 0x3f8),p);
  nni_aio_set_timeout(&p->negoaio,10000);
  nng_stream_send(p->conn,&p->negoaio);
  return;
}

Assistant:

static void
tcptran_pipe_start(tcptran_pipe *p, nng_stream *conn, tcptran_ep *ep)
{
	nni_iov iov;

	p->conn  = conn;
	p->ep    = ep;
	p->proto = ep->proto;

	p->txlen[0] = 0;
	p->txlen[1] = 'S';
	p->txlen[2] = 'P';
	p->txlen[3] = 0;
	NNI_PUT16(&p->txlen[4], p->proto);
	NNI_PUT16(&p->txlen[6], 0);

	p->gotrxhead  = 0;
	p->gottxhead  = 0;
	p->wantrxhead = 8;
	p->wanttxhead = 8;
	iov.iov_len   = 8;
	iov.iov_buf   = &p->txlen[0];
	nni_aio_set_iov(&p->negoaio, 1, &iov);
	nni_list_append(&ep->negopipes, p);

	nni_aio_set_timeout(&p->negoaio, 10000); // 10 sec timeout to negotiate
	nng_stream_send(p->conn, &p->negoaio);
}